

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O1

void __thiscall Liby::EventQueue::EventQueue(EventQueue *this,Poller *poller)

{
  unique_ptr<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_> *this_00;
  int iVar1;
  _Head_base<0UL,_Liby::FileDescriptor_*,_false> __ptr_00;
  Poller *pPVar2;
  FileDescriptor fd;
  _Head_base<0UL,_Liby::FileDescriptor_*,_false> this_01;
  pointer __p_00;
  Logger *pLVar3;
  int *piVar4;
  pointer __p;
  pointer *__ptr;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  FileDescriptor *local_38;
  
  this->poller_ = poller;
  this->eventfd_ = -1;
  this_00 = &this->eventfp_;
  (this->eventfp_)._M_t.
  super___uniq_ptr_impl<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>._M_t.
  super__Tuple_impl<0UL,_Liby::FileDescriptor_*,_std::default_delete<Liby::FileDescriptor>_>.
  super__Head_base<0UL,_Liby::FileDescriptor_*,_false>._M_head_impl = (FileDescriptor *)0x0;
  (this->eventChanelPtr_)._M_t.
  super___uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>._M_t.
  super__Tuple_impl<0UL,_Liby::Channel_*,_std::default_delete<Liby::Channel>_>.
  super__Head_base<0UL,_Liby::Channel_*,_false>._M_head_impl = (Channel *)0x0;
  BlockingQueue<std::function<void_()>_>::BlockingQueue
            (&this->eventHandlers_,(initializer_list<std::function<void_()>_>)ZEXT816(0));
  if (this->poller_ == (Poller *)0x0) {
    pLVar3 = Logger::getLogger();
    Logger::log(pLVar3,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  else {
    fd.fd_ = eventfd(1000,0x80800);
    this->eventfd_ = fd.fd_;
    if (-1 < fd.fd_) {
      this_01._M_head_impl = (FileDescriptor *)operator_new(4);
      (this_01._M_head_impl)->fd_ = fd.fd_;
      FileDescriptor::check_fd(this_01._M_head_impl,fd.fd_);
      local_38 = (FileDescriptor *)0x0;
      __ptr_00._M_head_impl =
           (this_00->_M_t).
           super___uniq_ptr_impl<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>.
           _M_t.
           super__Tuple_impl<0UL,_Liby::FileDescriptor_*,_std::default_delete<Liby::FileDescriptor>_>
           .super__Head_base<0UL,_Liby::FileDescriptor_*,_false>._M_head_impl;
      (this_00->_M_t).
      super___uniq_ptr_impl<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>._M_t.
      super__Tuple_impl<0UL,_Liby::FileDescriptor_*,_std::default_delete<Liby::FileDescriptor>_>.
      super__Head_base<0UL,_Liby::FileDescriptor_*,_false>._M_head_impl = this_01._M_head_impl;
      if (__ptr_00._M_head_impl != (FileDescriptor *)0x0) {
        std::default_delete<Liby::FileDescriptor>::operator()
                  ((default_delete<Liby::FileDescriptor> *)this_00,__ptr_00._M_head_impl);
      }
      if (local_38 != (FileDescriptor *)0x0) {
        std::default_delete<Liby::FileDescriptor>::operator()
                  ((default_delete<Liby::FileDescriptor> *)&local_38,local_38);
      }
      FileDescriptor::set_noblock
                ((this_00->_M_t).
                 super___uniq_ptr_impl<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Liby::FileDescriptor_*,_std::default_delete<Liby::FileDescriptor>_>
                 .super__Head_base<0UL,_Liby::FileDescriptor_*,_false>._M_head_impl,true);
      __p_00 = (pointer)operator_new(0x70);
      pPVar2 = this->poller_;
      iVar1 = this->eventfd_;
      (__p_00->erroEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
      (__p_00->erroEventCallback_)._M_invoker = (_Invoker_type)0x0;
      *(undefined8 *)&(__p_00->erroEventCallback_).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(__p_00->erroEventCallback_).super__Function_base._M_functor + 8) = 0;
      (__p_00->writEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
      (__p_00->writEventCallback_)._M_invoker = (_Invoker_type)0x0;
      *(undefined8 *)&(__p_00->writEventCallback_).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(__p_00->writEventCallback_).super__Function_base._M_functor + 8) = 0;
      (__p_00->readEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
      (__p_00->readEventCallback_)._M_invoker = (_Invoker_type)0x0;
      *(undefined8 *)&(__p_00->readEventCallback_).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(__p_00->readEventCallback_).super__Function_base._M_functor + 8) = 0;
      __p_00->readable_ = false;
      __p_00->writable_ = false;
      __p_00->old_readable_ = false;
      __p_00->old_writable_ = false;
      __p_00->fd_ = iVar1;
      __p_00->poller_ = pPVar2;
      if ((pPVar2 != (Poller *)0x0) && (-1 < iVar1)) {
        std::__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>::reset
                  ((__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_> *)
                   &this->eventChanelPtr_,__p_00);
        return;
      }
      __assert_fail("fd >= 0 && poller",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Channel.h"
                    ,0xe,"Liby::Channel::Channel(Poller *, int)");
    }
    pLVar3 = Logger::getLogger();
    piVar4 = __errno_location();
    strerror(*piVar4);
    Logger::log(pLVar3,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  }
  exit(1);
}

Assistant:

EventQueue::EventQueue(Poller *poller) : poller_(poller) {
    fatalif(poller_ == nullptr, "Poller cannot be nullptr");
#ifdef __linux__
    eventfd_ = ::eventfd(1000, EFD_CLOEXEC | EFD_NONBLOCK);
    fatalif(eventfd_ < 0, "eventfd create: %s", ::strerror(errno));
    eventfp_ = std::make_unique<FileDescriptor>(eventfd_);
    eventfp_->set_noblock();
#elif defined(__APPLE__)
    int fds[2];
    if (::pipe(fds) < 0)
        fatal("pipe: %s", ::strerror(errno));
    eventfd_ = fds[0];
    event2fd_ = fds[1];
    eventfp_ = std::make_unique<FileDescriptor>(eventfd_);
    event2fp_ = std::make_unique<FileDescriptor>(event2fd_);
    eventfp_->set_noblock();
    event2fp_->set_noblock();
#endif
    eventChanelPtr_ = std::make_unique<Channel>(poller_, eventfd_);
}